

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_submodule *
ly_ctx_get_submodule(ly_ctx *ctx,char *module,char *revision,char *submodule,char *sub_revision)

{
  lys_submodule *plVar1;
  int iVar2;
  LY_ERR *pLVar3;
  uint32_t local_54;
  lys_submodule *plStack_50;
  uint32_t idx;
  lys_submodule *submod;
  lys_submodule *ret;
  lys_module *mainmod;
  char *sub_revision_local;
  char *submodule_local;
  char *revision_local;
  char *module_local;
  ly_ctx *ctx_local;
  
  submod = (lys_submodule *)0x0;
  local_54 = 0;
  mainmod = (lys_module *)sub_revision;
  sub_revision_local = submodule;
  submodule_local = revision;
  revision_local = module;
  module_local = (char *)ctx;
  if (((ctx == (ly_ctx *)0x0) || (submodule == (char *)0x0)) ||
     ((plVar1 = submod, revision != (char *)0x0 && (module == (char *)0x0)))) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    do {
      while( true ) {
        do {
          submod = plVar1;
          ret = (lys_submodule *)ly_ctx_get_module_iter((ly_ctx *)module_local,&local_54);
          if ((lys_module *)ret == (lys_module *)0x0) goto LAB_00110e4a;
        } while ((((revision_local != (char *)0x0) &&
                  (iVar2 = strcmp(((lys_module *)ret)->name,revision_local), plVar1 = submod,
                  iVar2 != 0)) ||
                 ((submodule_local != (char *)0x0 &&
                  ((plVar1 = submod, ret->rev == (lys_revision *)0x0 ||
                   (iVar2 = strcmp(submodule_local,ret->rev->date), plVar1 = submod, iVar2 != 0)))))
                 ) || (plStack_50 = ly_ctx_get_submodule2((lys_module *)ret,sub_revision_local),
                      plVar1 = submod, plStack_50 == (lys_submodule *)0x0));
        if (mainmod != (lys_module *)0x0) break;
        plVar1 = plStack_50;
        if (((submod != (lys_submodule *)0x0) &&
            (plVar1 = submod, plStack_50->rev != (lys_revision *)0x0)) &&
           ((submod->rev == (lys_revision *)0x0 ||
            (iVar2 = strcmp(plStack_50->rev->date,submod->rev->date), plVar1 = submod, 0 < iVar2))))
        {
          submod = plStack_50;
          plVar1 = submod;
        }
      }
    } while ((plStack_50->rev == (lys_revision *)0x0) ||
            (iVar2 = strcmp((char *)mainmod,plStack_50->rev->date), plVar1 = submod, iVar2 != 0));
    submod = plStack_50;
LAB_00110e4a:
    ctx_local = (ly_ctx *)submod;
  }
  return (lys_submodule *)ctx_local;
}

Assistant:

lys_submodule *
ly_ctx_get_submodule(const struct ly_ctx *ctx, const char *module, const char *revision, const char *submodule,
                     const char *sub_revision)
{
    const struct lys_module *mainmod;
    const struct lys_submodule *ret = NULL, *submod;
    uint32_t idx = 0;

    if (!ctx || !submodule || (revision && !module)) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    while ((mainmod = ly_ctx_get_module_iter(ctx, &idx))) {
        if (module && strcmp(mainmod->name, module)) {
            /* main module name does not match */
            continue;
        }

        if (revision && (!mainmod->rev || strcmp(revision, mainmod->rev[0].date))) {
            /* main module revision does not match */
            continue;
        }

        submod = ly_ctx_get_submodule2(mainmod, submodule);
        if (!submod) {
            continue;
        }

        if (!sub_revision) {
            /* store only if newer */
            if (ret) {
                if (submod->rev && (!ret->rev || (strcmp(submod->rev[0].date, ret->rev[0].date) > 0))) {
                    ret = submod;
                }
            } else {
                ret = submod;
            }
        } else {
            /* store only if revision matches, we are done if it does */
            if (!submod->rev) {
                continue;
            } else if (!strcmp(sub_revision, submod->rev[0].date)) {
                ret = submod;
                break;
            }
        }
    }

    return ret;
}